

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeKindedSources(cmGeneratorTarget *this,KindedSources *files,string *config)

{
  size_t *this_00;
  cmSourceFile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  cmCustomCommand *pcVar4;
  ulong uVar5;
  ostream *poVar6;
  string *psVar7;
  reference ppcVar8;
  cmSourceFileLocation *this_01;
  cmake *this_02;
  pair<std::_Rb_tree_const_iterator<cmSourceFile_*>,_bool> pVar9;
  undefined1 local_440 [16];
  string local_430;
  undefined1 local_410 [8];
  cmSourceFile *i;
  iterator __end2;
  iterator __begin2;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range2;
  ostringstream e;
  cmListFileBacktrace local_278;
  value_type local_268;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  undefined1 local_1d0 [8];
  string ext;
  SourceKind kind;
  cmSourceFile *local_188;
  cmSourceFile *sf;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *s;
  iterator __end1;
  iterator __begin1;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> badObjLib;
  undefined1 local_108 [8];
  RegularExpression header_regex;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  srcs;
  string *config_local;
  KindedSources *files_local;
  cmGeneratorTarget *this_local;
  
  GetSourceFilePaths((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&header_regex.progsize,this,config);
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)local_108,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
             &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::set
            ((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> *)
             &__range1);
  __end1 = std::
           vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&header_regex.progsize);
  s = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::end((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&header_regex.progsize);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&s), bVar2) {
    sf = (cmSourceFile *)
         __gnu_cxx::
         __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::operator*(&__end1);
    local_188 = cmMakefile::GetOrCreateSource(this->Makefile,(string *)sf,false,Ambiguous);
    pVar9 = std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::
            insert((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
                    *)&__range1,&local_188);
    if (((pVar9.second ^ 0xffU) & 1) == 0) {
      psVar7 = cmSourceFile::GetExtension_abi_cxx11_(local_188);
      cmsys::SystemTools::LowerCase((string *)local_1d0,psVar7);
      pcVar4 = cmSourceFile::GetCustomCommand(local_188);
      if (pcVar4 == (cmCustomCommand *)0x0) {
        TVar3 = cmTarget::GetType(this->Target);
        if ((TVar3 == UTILITY) ||
           (TVar3 = cmTarget::GetType(this->Target), TVar3 == INTERFACE_LIBRARY)) {
          ext.field_2._12_4_ = 4;
        }
        else {
          psVar7 = cmSourceFile::ResolveFullPath(local_188,(string *)0x0,(string *)0x0);
          bVar2 = IsSourceFilePartOfUnityBatch(this,psVar7);
          pcVar1 = local_188;
          if (bVar2) {
            ext.field_2._12_4_ = 0xc;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1f0,"HEADER_FILE_ONLY",&local_1f1);
            bVar2 = cmSourceFile::GetPropertyAsBool(pcVar1,&local_1f0);
            std::__cxx11::string::~string((string *)&local_1f0);
            std::allocator<char>::~allocator(&local_1f1);
            pcVar1 = local_188;
            if (bVar2) {
              ext.field_2._12_4_ = 5;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_218,"EXTERNAL_OBJECT",&local_219);
              bVar2 = cmSourceFile::GetPropertyAsBool(pcVar1,&local_218);
              std::__cxx11::string::~string((string *)&local_218);
              std::allocator<char>::~allocator(&local_219);
              if (bVar2) {
                ext.field_2._12_4_ = 3;
              }
              else {
                cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(local_188);
                uVar5 = std::__cxx11::string::empty();
                if ((uVar5 & 1) == 0) {
                  ext.field_2._12_4_ = 9;
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1d0,"def");
                  if (bVar2) {
                    ext.field_2._12_4_ = 8;
                    TVar3 = GetType(this);
                    if (TVar3 == OBJECT_LIBRARY) {
                      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                                 &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 &local_188);
                    }
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_1d0,"idl");
                    if (bVar2) {
                      ext.field_2._12_4_ = 6;
                      TVar3 = GetType(this);
                      if (TVar3 == OBJECT_LIBRARY) {
                        std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                                  ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                                   &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                   &local_188);
                      }
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_1d0,"resx");
                      if (bVar2) {
                        ext.field_2._12_4_ = 10;
                      }
                      else {
                        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_1d0,"appxmanifest");
                        if (bVar2) {
                          ext.field_2._12_4_ = 0;
                        }
                        else {
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1d0,"manifest");
                          pcVar1 = local_188;
                          if (bVar2) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_240,"VS_DEPLOYMENT_CONTENT",&local_241);
                            bVar2 = cmSourceFile::GetPropertyAsBool(pcVar1,&local_240);
                            std::__cxx11::string::~string((string *)&local_240);
                            std::allocator<char>::~allocator(&local_241);
                            if (bVar2) {
                              ext.field_2._12_4_ = 4;
                            }
                            else {
                              ext.field_2._12_4_ = 7;
                            }
                          }
                          else {
                            bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1d0,"pfx");
                            if (bVar2) {
                              ext.field_2._12_4_ = 1;
                            }
                            else {
                              bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1d0,"xaml");
                              if (bVar2) {
                                ext.field_2._12_4_ = 0xb;
                              }
                              else {
                                psVar7 = cmSourceFile::ResolveFullPath
                                                   (local_188,(string *)0x0,(string *)0x0);
                                bVar2 = cmsys::RegularExpression::find
                                                  ((RegularExpression *)local_108,psVar7);
                                if (bVar2) {
                                  ext.field_2._12_4_ = 5;
                                }
                                else {
                                  ext.field_2._12_4_ = 4;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        ext.field_2._12_4_ = 2;
      }
      pcVar1 = local_188;
      cmListFileBacktrace::cmListFileBacktrace
                (&local_278,(cmListFileBacktrace *)&(sf->Location).Directory.field_2);
      BT<cmSourceFile_*>::BT(&local_268.Source,pcVar1,&local_278);
      local_268.Kind = ext.field_2._12_4_;
      std::
      vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>::
      push_back(&files->Sources,&local_268);
      SourceAndKind::~SourceAndKind(&local_268);
      cmListFileBacktrace::~cmListFileBacktrace(&local_278);
      std::__cxx11::string::~string((string *)local_1d0);
    }
    __gnu_cxx::
    __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  bVar2 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::empty
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                     &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range2);
    poVar6 = std::operator<<((ostream *)&__range2,"OBJECT library \"");
    psVar7 = GetName_abi_cxx11_(this);
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    std::operator<<(poVar6,"\" contains:\n");
    this_00 = &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end2 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                       ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)this_00);
    i = (cmSourceFile *)
        std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                  ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                       *)&i), bVar2) {
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                ::operator*(&__end2);
      local_410 = (undefined1  [8])*ppcVar8;
      poVar6 = std::operator<<((ostream *)&__range2,"  ");
      this_01 = cmSourceFile::GetLocation((cmSourceFile *)local_410);
      psVar7 = cmSourceFileLocation::GetName_abi_cxx11_(this_01);
      poVar6 = std::operator<<(poVar6,(string *)psVar7);
      std::operator<<(poVar6,"\n");
      __gnu_cxx::
      __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
      ::operator++(&__end2);
    }
    std::operator<<((ostream *)&__range2,
                    "but may contain only sources that compile, header files, and other files that would not affect linking of a normal library."
                   );
    this_02 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
    std::__cxx11::ostringstream::str();
    GetBacktrace((cmGeneratorTarget *)local_440);
    cmake::IssueMessage(this_02,FATAL_ERROR,(string *)(local_440 + 0x10),
                        (cmListFileBacktrace *)local_440);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_440);
    std::__cxx11::string::~string((string *)(local_440 + 0x10));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range2);
  }
  std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::~set
            ((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> *)
             &__range1);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
             &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_108);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&header_regex.progsize);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeKindedSources(KindedSources& files,
                                             std::string const& config) const
{
  // Get the source file paths by string.
  std::vector<BT<std::string>> srcs = this->GetSourceFilePaths(config);

  cmsys::RegularExpression header_regex(CM_HEADER_REGEX);
  std::vector<cmSourceFile*> badObjLib;

  std::set<cmSourceFile*> emitted;
  for (BT<std::string> const& s : srcs) {
    // Create each source at most once.
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(s.Value);
    if (!emitted.insert(sf).second) {
      continue;
    }

    // Compute the kind (classification) of this source file.
    SourceKind kind;
    std::string ext = cmSystemTools::LowerCase(sf->GetExtension());
    if (sf->GetCustomCommand()) {
      kind = SourceKindCustomCommand;
    } else if (this->Target->GetType() == cmStateEnums::UTILITY ||
               this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY
               // XXX(clang-tidy): https://bugs.llvm.org/show_bug.cgi?id=44165
               // NOLINTNEXTLINE(bugprone-branch-clone)
    ) {
      kind = SourceKindExtra;
    } else if (this->IsSourceFilePartOfUnityBatch(sf->ResolveFullPath())) {
      kind = SourceKindUnityBatched;
      // XXX(clang-tidy): https://bugs.llvm.org/show_bug.cgi?id=44165
      // NOLINTNEXTLINE(bugprone-branch-clone)
    } else if (sf->GetPropertyAsBool("HEADER_FILE_ONLY")) {
      kind = SourceKindHeader;
    } else if (sf->GetPropertyAsBool("EXTERNAL_OBJECT")) {
      kind = SourceKindExternalObject;
    } else if (!sf->GetOrDetermineLanguage().empty()) {
      kind = SourceKindObjectSource;
    } else if (ext == "def") {
      kind = SourceKindModuleDefinition;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "idl") {
      kind = SourceKindIDL;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "resx") {
      kind = SourceKindResx;
    } else if (ext == "appxmanifest") {
      kind = SourceKindAppManifest;
    } else if (ext == "manifest") {
      if (sf->GetPropertyAsBool("VS_DEPLOYMENT_CONTENT")) {
        kind = SourceKindExtra;
      } else {
        kind = SourceKindManifest;
      }
    } else if (ext == "pfx") {
      kind = SourceKindCertificate;
    } else if (ext == "xaml") {
      kind = SourceKindXaml;
    } else if (header_regex.find(sf->ResolveFullPath())) {
      kind = SourceKindHeader;
    } else {
      kind = SourceKindExtra;
    }

    // Save this classified source file in the result vector.
    files.Sources.push_back({ BT<cmSourceFile*>(sf, s.Backtrace), kind });
  }

  if (!badObjLib.empty()) {
    std::ostringstream e;
    e << "OBJECT library \"" << this->GetName() << "\" contains:\n";
    for (cmSourceFile* i : badObjLib) {
      e << "  " << i->GetLocation().GetName() << "\n";
    }
    e << "but may contain only sources that compile, header files, and "
         "other files that would not affect linking of a normal library.";
    this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR, e.str(), this->GetBacktrace());
  }
}